

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::hadCommandFailure
          (CAPIBuildSystemFrontendDelegate *this)

{
  CAPIBuildSystemFrontendDelegate *this_local;
  
  llbuild::buildsystem::BuildSystemFrontendDelegate::hadCommandFailure
            (&this->super_BuildSystemFrontendDelegate);
  if ((this->cAPIDelegate).had_command_failure == (_func_void_void_ptr *)0x0) {
    (*(this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate
      [0x14])();
  }
  else {
    (*(this->cAPIDelegate).had_command_failure)((this->cAPIDelegate).context);
  }
  return;
}

Assistant:

virtual void hadCommandFailure() override {
    // Call the base implementation.
    BuildSystemFrontendDelegate::hadCommandFailure();

    // Report the command failure, if the client provided an appropriate
    // callback.
    if (cAPIDelegate.had_command_failure) {
      cAPIDelegate.had_command_failure(cAPIDelegate.context);
    } else {
      // Otherwise, the default behavior is to immediately cancel.
      cancel();
    }
  }